

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dir.c
# Opt level: O2

int init_finfo(void)

{
  FINFO *pFVar1;
  int *piVar2;
  uint uVar3;
  
  FreeFinfoList = (FINFO *)calloc(0x340,0x400);
  if (FreeFinfoList != (FINFO *)0x0) {
    uVar3 = 0x400;
    pFVar1 = FreeFinfoList;
    while( true ) {
      pFVar1->prop = (FPROP *)(pFVar1 + 1);
      if (uVar3 < 2) break;
      pFVar1->next = (finfo *)(pFVar1[1].no_ver_name + 0x10);
      uVar3 = uVar3 - 1;
      pFVar1 = (finfo *)(pFVar1[1].no_ver_name + 0x10);
    }
    pFVar1->next = (finfo *)0x0;
    FinfoArray = (DFINFO *)calloc(0x10,0x20);
    if (FinfoArray != (DFINFO *)0x0) {
      MAXFINFO = 0x20;
      return 1;
    }
  }
  piVar2 = __errno_location();
  *Lisp_errno = *piVar2;
  return 0;
}

Assistant:

int init_finfo(void) {
  FINFO *cp;
  int n;

  if ((FreeFinfoList = (FINFO *)calloc(sizeof(FINFO) + sizeof(FPROP), INITFINFONUM)) ==
      (FINFO *)NULL) {
    *Lisp_errno = errno;
    return (0);
  }
  for (cp = FreeFinfoList, n = INITFINFONUM; n > 1; n--) {
    cp->prop = (FPROP *)(cp + 1);
    cp->next = (FINFO *)((char *)cp + sizeof(FINFO) + sizeof(FPROP));
    cp = cp->next;
  }
  cp->prop = (FPROP *)(cp + 1);
  cp->next = (FINFO *)NULL;

  if ((FinfoArray = (DFINFO *)calloc(sizeof(DFINFO), INITFINFOARRAY)) == (DFINFO *)NULL) {
    *Lisp_errno = errno;
    return (0);
  }
  MAXFINFO = INITFINFOARRAY;

  return (1);
}